

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswFilter.c
# Opt level: O3

void Ssw_ManFindStartingState(Ssw_Man_t *p,Abc_Cex_t *pCex)

{
  ulong *puVar1;
  undefined1 *puVar2;
  void *pvVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  Aig_Man_t *pAVar8;
  uint uVar9;
  long lVar10;
  Vec_Ptr_t *pVVar11;
  uint uVar12;
  
  pAVar8 = p->pAig;
  if (0 < pAVar8->nRegs) {
    iVar5 = 0;
    do {
      uVar6 = pAVar8->nTruePos + iVar5;
      if (((int)uVar6 < 0) || (pAVar8->vCos->nSize <= (int)uVar6)) goto LAB_006ad8db;
      puVar1 = (ulong *)((long)pAVar8->vCos->pArray[uVar6] + 0x18);
      *puVar1 = *puVar1 & 0xffffffffffffffdf;
      iVar5 = iVar5 + 1;
      pAVar8 = p->pAig;
    } while (iVar5 < pAVar8->nRegs);
  }
  uVar6 = pCex->nRegs;
  if (-1 < pCex->iFrame) {
    iVar5 = 0;
    do {
      puVar2 = &pAVar8->pConst1->field_0x18;
      *(ulong *)puVar2 = *(ulong *)puVar2 | 0x20;
      pAVar8 = p->pAig;
      if (0 < pAVar8->nTruePis) {
        lVar10 = 0;
        do {
          if (pAVar8->vCis->nSize <= lVar10) goto LAB_006ad8db;
          pvVar3 = pAVar8->vCis->pArray[lVar10];
          *(ulong *)((long)pvVar3 + 0x18) =
               *(ulong *)((long)pvVar3 + 0x18) & 0xffffffffffffffdf |
               (ulong)(((uint)(&pCex[1].iPo)[(int)((ulong)uVar6 + lVar10) >> 5] >>
                        ((byte)((ulong)uVar6 + lVar10) & 0x1f) & 1) << 5);
          lVar10 = lVar10 + 1;
          pAVar8 = p->pAig;
        } while (lVar10 < pAVar8->nTruePis);
        uVar6 = uVar6 + (int)lVar10;
      }
      if (0 < pAVar8->nRegs) {
        iVar7 = 0;
        do {
          uVar9 = pAVar8->nTruePos + iVar7;
          if (((((int)uVar9 < 0) || (pAVar8->vCos->nSize <= (int)uVar9)) ||
              (uVar12 = pAVar8->nTruePis + iVar7, (int)uVar12 < 0)) ||
             (pAVar8->vCis->nSize <= (int)uVar12)) goto LAB_006ad8db;
          pvVar3 = pAVar8->vCis->pArray[uVar12];
          *(ulong *)((long)pvVar3 + 0x18) =
               *(ulong *)((long)pvVar3 + 0x18) & 0xffffffffffffffdf |
               (ulong)((uint)*(undefined8 *)((long)pAVar8->vCos->pArray[uVar9] + 0x18) & 0x20);
          iVar7 = iVar7 + 1;
          pAVar8 = p->pAig;
        } while (iVar7 < pAVar8->nRegs);
      }
      pVVar11 = pAVar8->vObjs;
      if (0 < pVVar11->nSize) {
        lVar10 = 0;
        do {
          pvVar3 = pVVar11->pArray[lVar10];
          if ((pvVar3 != (void *)0x0) &&
             (0xfffffffd < ((uint)*(ulong *)((long)pvVar3 + 0x18) & 7) - 7)) {
            *(ulong *)((long)pvVar3 + 0x18) =
                 *(ulong *)((long)pvVar3 + 0x18) & 0xffffffffffffffdf |
                 (ulong)((((uint)*(ulong *)((long)pvVar3 + 0x10) ^
                          *(uint *)((*(ulong *)((long)pvVar3 + 0x10) & 0xfffffffffffffffe) + 0x18)
                          >> 5) & ((uint)*(ulong *)((long)pvVar3 + 8) ^
                                  *(uint *)((*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe) +
                                           0x18) >> 5) & 1) << 5);
            pAVar8 = p->pAig;
          }
          lVar10 = lVar10 + 1;
          pVVar11 = pAVar8->vObjs;
        } while (lVar10 < pVVar11->nSize);
      }
      pVVar11 = pAVar8->vCos;
      if (0 < pVVar11->nSize) {
        lVar10 = 0;
        do {
          pvVar3 = pVVar11->pArray[lVar10];
          *(ulong *)((long)pvVar3 + 0x18) =
               *(ulong *)((long)pvVar3 + 0x18) & 0xffffffffffffffdf |
               (ulong)(((int)*(ulong *)((long)pvVar3 + 8) << 5 ^
                       *(uint *)((*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe) + 0x18)) & 0x20
                      );
          lVar10 = lVar10 + 1;
          pAVar8 = p->pAig;
          pVVar11 = pAVar8->vCos;
        } while (lVar10 < pVVar11->nSize);
      }
      bVar4 = iVar5 < pCex->iFrame;
      iVar5 = iVar5 + 1;
    } while (bVar4);
  }
  if (uVar6 != pCex->nBits) {
    __assert_fail("iBit == pCex->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswFilter.c"
                  ,0xa3,"void Ssw_ManFindStartingState(Ssw_Man_t *, Abc_Cex_t *)");
  }
  iVar5 = pAVar8->nRegs;
  if (0 < iVar5) {
    pVVar11 = pAVar8->vCis;
    iVar7 = 0;
    do {
      uVar6 = pAVar8->nTruePis + iVar7;
      if (((int)uVar6 < 0) || (pVVar11->nSize <= (int)uVar6)) {
LAB_006ad8db:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      uVar9 = p->pPatWords[uVar6 >> 5];
      if (((uVar9 >> (sbyte)(uVar6 & 0x1f) ^ *(uint *)((long)pVVar11->pArray[uVar6] + 0x18) >> 5) &
          1) != 0) {
        p->pPatWords[uVar6 >> 5] = uVar9 ^ 1 << (uVar6 & 0x1f);
        iVar5 = pAVar8->nRegs;
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 < iVar5);
  }
  return;
}

Assistant:

void Ssw_ManFindStartingState( Ssw_Man_t * p, Abc_Cex_t * pCex )
{
    Aig_Obj_t * pObj, * pObjLi;
    int f, i, iBit;
    // assign register outputs
    Saig_ManForEachLi( p->pAig, pObj, i )
        pObj->fMarkB = 0;
    // simulate the timeframes
    iBit = pCex->nRegs;
    for ( f = 0; f <= pCex->iFrame; f++ )
    {
        // set the PI simulation information
        Aig_ManConst1(p->pAig)->fMarkB = 1;
        Saig_ManForEachPi( p->pAig, pObj, i )
            pObj->fMarkB = Abc_InfoHasBit( pCex->pData, iBit++ );
        Saig_ManForEachLiLo( p->pAig, pObjLi, pObj, i )
            pObj->fMarkB = pObjLi->fMarkB;
        // simulate internal nodes
        Aig_ManForEachNode( p->pAig, pObj, i )
            pObj->fMarkB = ( Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj) )
                         & ( Aig_ObjFanin1(pObj)->fMarkB ^ Aig_ObjFaninC1(pObj) );
        // assign the COs
        Aig_ManForEachCo( p->pAig, pObj, i )
            pObj->fMarkB = ( Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj) );
    }
    assert( iBit == pCex->nBits );
    // check that the output failed as expected -- cannot check because it is not an SRM!
//    pObj = Aig_ManCo( p->pAig, pCex->iPo );
//    if ( pObj->fMarkB != 1 )
//        Abc_Print( 1, "The counter-example does not refine the output.\n" );
    // record the new pattern
    Saig_ManForEachLo( p->pAig, pObj, i )
        if ( pObj->fMarkB ^ Abc_InfoHasBit(p->pPatWords, Saig_ManPiNum(p->pAig) + i) )
            Abc_InfoXorBit( p->pPatWords, Saig_ManPiNum(p->pAig) + i );
}